

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_NtkCollectDistrib(Cba_Ntk_t *p,int *pCounts,int *pUserCounts)

{
  int iVar1;
  Cba_ObjType_t CVar2;
  int *piVar3;
  int i;
  int i_00;
  
  for (i_00 = 1; i_00 < (p->vObjType).nSize; i_00 = i_00 + 1) {
    iVar1 = Cba_ObjIsBox(p,i_00);
    if (iVar1 != 0) {
      iVar1 = Cba_ObjIsBoxUser(p,i_00);
      if (iVar1 == 0) {
        CVar2 = Cba_ObjType(p,i_00);
        piVar3 = pCounts + CVar2;
      }
      else {
        iVar1 = Cba_ObjNtkId(p,i_00);
        piVar3 = pUserCounts + iVar1;
      }
      *piVar3 = *piVar3 + 1;
    }
  }
  return;
}

Assistant:

void Cba_NtkCollectDistrib( Cba_Ntk_t * p, int * pCounts, int * pUserCounts )
{
    int i;
    Cba_NtkForEachBox( p, i )
        if ( Cba_ObjIsBoxUser(p, i) )
            pUserCounts[Cba_ObjNtkId(p, i)]++;
        else
            pCounts[Cba_ObjType(p, i)]++;
}